

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

int k2proto(FuncState *fs,TValue *key,TValue *v)

{
  Proto *f;
  byte bVar1;
  int iVar2;
  TValue *io;
  TValue val;
  Value local_38;
  undefined1 local_30;
  
  f = fs->f;
  bVar1 = luaH_get(fs->kcache,key,(TValue *)&local_38);
  if ((bVar1 & 0xf) == 0) {
    iVar2 = addk(fs,f,v);
    local_38 = (Value)(long)iVar2;
    local_30 = 3;
    luaH_set(fs->ls->L,fs->kcache,key,(TValue *)&local_38);
    local_38.i._0_4_ = iVar2;
  }
  return local_38.i._0_4_;
}

Assistant:

static int k2proto (FuncState *fs, TValue *key, TValue *v) {
  TValue val;
  Proto *f = fs->f;
  int tag = luaH_get(fs->kcache, key, &val);  /* query scanner table */
  int k;
  if (!tagisempty(tag)) {  /* is there an index there? */
    k = cast_int(ivalue(&val));
    /* collisions can happen only for float keys */
    lua_assert(ttisfloat(key) || luaV_rawequalobj(&f->k[k], v));
    return k;  /* reuse index */
  }
  /* constant not found; create a new entry */
  k = addk(fs, f, v);
  /* cache it for reuse; numerical value does not need GC barrier;
     table is not a metatable, so it does not need to invalidate cache */
  setivalue(&val, k);
  luaH_set(fs->ls->L, fs->kcache, key, &val);
  return k;
}